

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

char * print_token(lyxp_token tok)

{
  char *pcStack_10;
  lyxp_token tok_local;
  
  if (tok - LYXP_TOKEN_PAR1 < 0x11 || tok == LYXP_TOKEN_NUMBER) {
    switch((long)&switchD_001b2b51::switchdataD_002067bc +
           (long)(int)(&switchD_001b2b51::switchdataD_002067bc)[tok - LYXP_TOKEN_PAR1]) {
    case 0x1b2b53:
      pcStack_10 = "(";
      break;
    case 0x1b2b63:
      pcStack_10 = ")";
      break;
    case 0x1b2b73:
      pcStack_10 = "[";
      break;
    case 0x1b2b83:
      pcStack_10 = "]";
      break;
    case 0x1b2b93:
      pcStack_10 = ".";
      break;
    case 0x1b2ba3:
      pcStack_10 = "..";
      break;
    case 0x1b2bb3:
      pcStack_10 = "@";
      break;
    case 0x1b2bc3:
      pcStack_10 = ",";
      break;
    case 0x1b2bd3:
      pcStack_10 = "NameTest";
      break;
    case 0x1b2be3:
      pcStack_10 = "NodeType";
      break;
    case 0x1b2bf3:
      pcStack_10 = "FunctionName";
      break;
    case 0x1b2c03:
      pcStack_10 = "Operator(Logic)";
      break;
    case 0x1b2c10:
      pcStack_10 = "Operator(Comparison)";
      break;
    case 0x1b2c1d:
      pcStack_10 = "Operator(Math)";
      break;
    case 0x1b2c2a:
      pcStack_10 = "Operator(Union)";
      break;
    case 0x1b2c37:
      pcStack_10 = "Operator(Path)";
      break;
    case 0x1b2c44:
      pcStack_10 = "Literal";
      break;
    case 0x1b2c51:
      pcStack_10 = "Number";
    }
  }
  else {
    ly_log((ly_ctx *)0x0,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
           "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/xpath.c"
           ,0x95);
    pcStack_10 = "";
  }
  return pcStack_10;
}

Assistant:

static const char *
print_token(enum lyxp_token tok)
{
    switch (tok) {
    case LYXP_TOKEN_PAR1:
        return "(";
    case LYXP_TOKEN_PAR2:
        return ")";
    case LYXP_TOKEN_BRACK1:
        return "[";
    case LYXP_TOKEN_BRACK2:
        return "]";
    case LYXP_TOKEN_DOT:
        return ".";
    case LYXP_TOKEN_DDOT:
        return "..";
    case LYXP_TOKEN_AT:
        return "@";
    case LYXP_TOKEN_COMMA:
        return ",";
    case LYXP_TOKEN_NAMETEST:
        return "NameTest";
    case LYXP_TOKEN_NODETYPE:
        return "NodeType";
    case LYXP_TOKEN_FUNCNAME:
        return "FunctionName";
    case LYXP_TOKEN_OPERATOR_LOG:
        return "Operator(Logic)";
    case LYXP_TOKEN_OPERATOR_COMP:
        return "Operator(Comparison)";
    case LYXP_TOKEN_OPERATOR_MATH:
        return "Operator(Math)";
    case LYXP_TOKEN_OPERATOR_UNI:
        return "Operator(Union)";
    case LYXP_TOKEN_OPERATOR_PATH:
        return "Operator(Path)";
    case LYXP_TOKEN_LITERAL:
        return "Literal";
    case LYXP_TOKEN_NUMBER:
        return "Number";
    default:
        LOGINT(NULL);
        return "";
    }
}